

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O3

void __thiscall
helics::BrokerApp::processArgs
          (BrokerApp *this,
          unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *app)

{
  CoreType CVar1;
  helicsCLI11App *phVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args;
  char *pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  Broker *__tmp;
  ConnectionFailure *this_01;
  string_view brokerName;
  string_view message;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  phVar2 = (app->_M_t).
           super___uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>
           .super__Head_base<0UL,_helics::helicsCLI11App_*,_false>._M_head_impl;
  CVar1 = phVar2->coreType;
  args = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(this->name)._M_dataplus._M_p;
  pcVar3 = (char *)(this->name)._M_string_length;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,&phVar2->remArgs);
  brokerName._M_len = (ulong)CVar1;
  brokerName._M_str = pcVar3;
  BrokerFactory::create((CoreType)&local_48,brokerName,args);
  p_Var5 = p_Stack_40;
  peVar4 = local_48;
  local_48 = (element_type *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  peVar4 = (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4 != (element_type *)0x0) {
    iVar6 = (*peVar4->_vptr_Broker[4])();
    if ((char)iVar6 != '\0') {
      return;
    }
  }
  this_01 = (ConnectionFailure *)__cxa_allocate_exception(0x28);
  message._M_str = "Broker is unable to connect\n";
  message._M_len = 0x1c;
  ConnectionFailure::ConnectionFailure(this_01,message);
  __cxa_throw(this_01,&ConnectionFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void BrokerApp::processArgs(std::unique_ptr<helicsCLI11App>& app)
{
    auto& remArgs = app->remainArgs();
    try {
        broker = BrokerFactory::create(app->getCoreType(), name, remArgs);
    }
    catch (const helics::RegistrationFailure&) {
        if (!name.empty()) {
            broker = BrokerFactory::findBroker(name);
            if (broker) {
                return;
            }
        }
    }
    if (!broker || !broker->isConnected()) {
        throw(ConnectionFailure("Broker is unable to connect\n"));
    }
}